

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_DoTimerA2(opm_t *chip)

{
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  opm_t *chip_local;
  
  if (chip->cycles == 1) {
    chip->timer_a_load = chip->timer_loada;
  }
  local_11 = true;
  if (chip->mode_test[2] == '\0') {
    local_12 = false;
    if (chip->timer_a_load != '\0') {
      local_12 = chip->cycles == 0;
    }
    local_11 = local_12;
  }
  chip->timer_a_inc = local_11;
  local_13 = true;
  if (chip->timer_a_of == '\0') {
    local_14 = false;
    if (chip->timer_a_load != '\0') {
      local_14 = chip->timer_a_temp != '\0';
    }
    local_13 = local_14;
  }
  chip->timer_a_do_load = local_13;
  chip->timer_a_do_reset = chip->timer_a_temp;
  chip->timer_a_temp = (chip->timer_a_load != '\0' ^ 0xffU) & 1;
  if ((chip->timer_reseta == '\0') && (chip->ic == '\0')) {
    local_15 = false;
    if (chip->timer_irqa != '\0') {
      local_15 = chip->timer_a_of != '\0';
    }
    chip->timer_a_status = chip->timer_a_status | local_15;
  }
  else {
    chip->timer_a_status = '\0';
  }
  chip->timer_reseta = '\0';
  return;
}

Assistant:

static void OPM_DoTimerA2(opm_t *chip)
{
    if (chip->cycles == 1)
    {
        chip->timer_a_load = chip->timer_loada;
    }
    chip->timer_a_inc = chip->mode_test[2] || (chip->timer_a_load && chip->cycles == 0);
    chip->timer_a_do_load = chip->timer_a_of || (chip->timer_a_load && chip->timer_a_temp);
    chip->timer_a_do_reset = chip->timer_a_temp;
    chip->timer_a_temp = !chip->timer_a_load;
    if (chip->timer_reseta || chip->ic)
    {
        chip->timer_a_status = 0;
    }
    else
    {
        chip->timer_a_status |= chip->timer_irqa && chip->timer_a_of;
    }
    chip->timer_reseta = 0;
}